

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void Json::StreamWriterBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  Value VStack_38;
  
  Value::Value(&VStack_38,"All");
  pVVar1 = Value::operator[](settings,"commentStyle");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,"\t");
  pVVar1 = Value::operator[](settings,"indentation");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"enableYAMLCompatibility");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"dropNullPlaceholders");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"useSpecialFloats");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"emitUTF8");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,0x11);
  pVVar1 = Value::operator[](settings,"precision");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,"significant");
  pVVar1 = Value::operator[](settings,"precisionType");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  return;
}

Assistant:

void StreamWriterBuilder::setDefaults(Json::Value* settings) {
  //! [StreamWriterBuilderDefaults]
  (*settings)["commentStyle"] = "All";
  (*settings)["indentation"] = "\t";
  (*settings)["enableYAMLCompatibility"] = false;
  (*settings)["dropNullPlaceholders"] = false;
  (*settings)["useSpecialFloats"] = false;
  (*settings)["emitUTF8"] = false;
  (*settings)["precision"] = 17;
  (*settings)["precisionType"] = "significant";
  //! [StreamWriterBuilderDefaults]
}